

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table.cpp
# Opt level: O0

int __thiscall Symbol_Table::get_index(Symbol_Table *this,string *identifier)

{
  size_type sVar1;
  mapped_type *ppIVar2;
  string *identifier_local;
  Symbol_Table *this_local;
  
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentifierData_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentifierData_*>_>_>
          ::count(&this->class_scope,identifier);
  if (sVar1 == 0) {
    sVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentifierData_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentifierData_*>_>_>
            ::count(&this->subroutine_scope,identifier);
    if (sVar1 == 0) {
      this_local._4_4_ = -1;
    }
    else {
      ppIVar2 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentifierData_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentifierData_*>_>_>
                ::operator[](&this->subroutine_scope,identifier);
      this_local._4_4_ = (*ppIVar2)->index;
    }
  }
  else {
    ppIVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentifierData_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentifierData_*>_>_>
              ::operator[](&this->class_scope,identifier);
    this_local._4_4_ = (*ppIVar2)->index;
  }
  return this_local._4_4_;
}

Assistant:

int Symbol_Table::get_index(const std::string& identifier) {
    if (class_scope.count(identifier) > 0) {
        return class_scope[identifier]->index;
    }
    else if (subroutine_scope.count(identifier) > 0) {
        return subroutine_scope[identifier]->index;
    }

    else {
        return -1;
    }
}